

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutil.hpp
# Opt level: O0

void REQUIRE_EQUAL(uint32_t *a,uint32_t *b,size_t n,string *name)

{
  FILE *__stream;
  undefined8 uVar1;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i;
  int errors;
  ulong local_30;
  int local_24;
  
  local_24 = 0;
  for (local_30 = 0; __stream = _stderr, local_30 < in_RDX; local_30 = local_30 + 1) {
    if (*(int *)(in_RDI + local_30 * 4) != *(int *)(in_RSI + local_30 * 4)) {
      local_24 = local_24 + 1;
      if (local_24 == 5) {
        uVar1 = std::__cxx11::string::c_str();
        quit("%s not equal at position %lu/%lu -> expected=%u is=%u",uVar1,local_30,in_RDX - 1,
             (ulong)*(uint *)(in_RDI + local_30 * 4),(ulong)*(uint *)(in_RSI + local_30 * 4));
      }
      else {
        uVar1 = std::__cxx11::string::c_str();
        fprintf(__stream,"%s not equal at position %lu/%lu -> expected=%u is=%u\n",uVar1,local_30,
                in_RDX - 1,(ulong)*(uint *)(in_RDI + local_30 * 4),
                *(undefined4 *)(in_RSI + local_30 * 4));
      }
    }
  }
  if (local_24 != 0) {
    quit("NOT EQUAL!");
  }
  return;
}

Assistant:

void REQUIRE_EQUAL(
    const uint32_t* a, const uint32_t* b, size_t n, std::string name)
{
    int errors = 0;
    for (size_t i = 0; i < n; i++) {
        if (a[i] != b[i]) {
            errors++;
            if (errors == 5) {
                quit("%s not equal at position %lu/%lu -> expected=%u is=%u",
                    name.c_str(), i, n - 1, a[i], b[i]);
            } else {
                fprintf(stderr,
                    "%s not equal at position %lu/%lu -> expected=%u is=%u\n",
                    name.c_str(), i, n - 1, a[i], b[i]);
            }
        }
    }
    if (errors != 0) {
        quit("NOT EQUAL!");
    }
}